

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O1

bool EV_DoDoor(EVlDoor type,line_t_conflict *line,AActor *thing,int tag,double speed,int delay,
              int lock,int lightTag,bool boomgen,int topcountdown)

{
  player_t *ppVar1;
  DBot *pDVar2;
  PClass *pPVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  DDoor *pDVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  DSeqNode *curseq;
  sector_t_conflict *psVar9;
  DObject *pDVar10;
  byte bVar11;
  FSectorTagIterator it;
  FSoundID local_3c;
  FSectorTagIterator local_38;
  
  if ((lock == 0) || (bVar4 = P_CheckKeys(thing,lock,tag != 0), bVar4)) {
    if (tag != 0) {
      local_38.start = tagManager.TagHashFirst[tag & 0xff];
      bVar11 = 0;
      local_38.searchtag = tag;
      while (uVar5 = FSectorTagIterator::Next(&local_38), -1 < (int)uVar5) {
        psVar9 = sectors + uVar5;
        bVar4 = sector_t::PlaneMoving(psVar9,1);
        if (!bVar4) {
          pDVar7 = (DDoor *)M_Malloc_Dbg(0x88,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                         ,0x1f9);
          bVar11 = 1;
          DDoor::DDoor(pDVar7,(sector_t *)psVar9,type,speed,delay,lightTag,topcountdown);
        }
      }
      goto LAB_003e91c2;
    }
    if (line != (line_t_conflict *)0x0) {
      if (line->sidedef[1] == (side_t *)0x0) {
        local_3c.ID = S_FindSound("*usefail");
        S_Sound(thing,2,&local_3c,1.0,1.0);
      }
      else {
        psVar9 = line->sidedef[1]->sector;
        bVar4 = sector_t::PlaneMoving(psVar9,1);
        if (!bVar4) {
          pDVar7 = (DDoor *)M_Malloc_Dbg(0x88,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                         ,0x1f9);
          bVar11 = 1;
          DDoor::DDoor(pDVar7,(sector_t *)psVar9,type,speed,delay,lightTag,topcountdown);
          goto LAB_003e91c2;
        }
        if (!boomgen) {
          pDVar10 = (psVar9->ceilingdata).field_0.o;
          if ((pDVar10 != (DObject *)0x0) && ((pDVar10->ObjectFlags & 0x20) != 0)) {
            (psVar9->ceilingdata).field_0.p = (DSectorEffect *)0x0;
            pDVar10 = (DObject *)0x0;
          }
          pPVar3 = DDoor::RegistrationInfo.MyClass;
          if (pDVar10->Class == (PClass *)0x0) {
            iVar6 = (**pDVar10->_vptr_DObject)(pDVar10);
            pDVar10->Class = (PClass *)CONCAT44(extraout_var,iVar6);
          }
          pPVar8 = pDVar10->Class;
          bVar4 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar3 && bVar4) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar4 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar3) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if (bVar4) {
            pDVar7 = (DDoor *)(psVar9->ceilingdata).field_0.p;
            if ((pDVar7 != (DDoor *)0x0) &&
               (((pDVar7->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.
                 super_DObject.ObjectFlags & 0x20) != 0)) {
              (psVar9->ceilingdata).field_0.p = (DSectorEffect *)0x0;
              pDVar7 = (DDoor *)0x0;
            }
            bVar4 = true;
            if ((type == doorRaise) && (pDVar7->m_Type == doorRaise)) {
              if (pDVar7->m_Direction == -1) {
                pDVar7->m_Direction = 1;
                DDoor::DoorSound(pDVar7,true,(DSeqNode *)0x0);
              }
              else if (((line->activation & 0x210) == 0) &&
                      (ppVar1 = thing->player, ppVar1 != (player_t *)0x0)) {
                pDVar2 = (ppVar1->Bot).field_0.p;
                if (pDVar2 != (DBot *)0x0) {
                  if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)
                  goto LAB_003e923b;
                  (ppVar1->Bot).field_0.p = (DBot *)0x0;
                }
                pDVar7->m_Direction = -1;
                curseq = SN_CheckSequence((sector_t *)psVar9,2);
                bVar4 = false;
                DDoor::DoorSound(pDVar7,false,curseq);
                thing = (AActor *)0x1;
              }
              else {
LAB_003e923b:
                bVar4 = false;
                thing = (AActor *)0x0;
              }
            }
            bVar11 = (byte)thing;
            if (!bVar4) goto LAB_003e91c2;
          }
        }
      }
    }
  }
  bVar11 = 0;
LAB_003e91c2:
  return (bool)(bVar11 & 1);
}

Assistant:

bool EV_DoDoor (DDoor::EVlDoor type, line_t *line, AActor *thing,
				int tag, double speed, int delay, int lock, int lightTag, bool boomgen, int topcountdown)
{
	bool		rtn = false;
	int 		secnum;
	sector_t*	sec;

	if (lock != 0 && !P_CheckKeys (thing, lock, tag != 0))
		return false;

	if (tag == 0)
	{		// [RH] manual door
		if (!line)
			return false;

		// if the wrong side of door is pushed, give oof sound
		if (line->sidedef[1] == NULL)			// killough
		{
			S_Sound (thing, CHAN_VOICE, "*usefail", 1, ATTN_NORM);
			return false;
		}

		// get the sector on the second side of activating linedef
		sec = line->sidedef[1]->sector;
		secnum = int(sec-sectors);

		// if door already has a thinker, use it
		if (sec->PlaneMoving(sector_t::ceiling))
		{
			// Boom used remote door logic for generalized doors, even if they are manual
			if (boomgen)
				return false;
			if (sec->ceilingdata->IsKindOf (RUNTIME_CLASS(DDoor)))
			{
				DDoor *door = barrier_cast<DDoor *>(sec->ceilingdata);

				// ONLY FOR "RAISE" DOORS, NOT "OPEN"s
				if (door->m_Type == DDoor::doorRaise && type == DDoor::doorRaise)
				{
					if (door->m_Direction == -1)
					{
						door->m_Direction = 1;	// go back up
						door->DoorSound (true);	// [RH] Make noise
					}
					else if (!(line->activation & (SPAC_Push|SPAC_MPush)))
						// [RH] activate push doors don't go back down when you
						//		run into them (otherwise opening them would be
						//		a real pain).
					{
						if (!thing->player || thing->player->Bot != NULL)
							return false;	// JDC: bad guys never close doors
											//Added by MC: Neither do bots.

						door->m_Direction = -1;	// start going down immediately

						// Start the door close sequence.
						door->DoorSound(false, SN_CheckSequence(sec, CHAN_CEILING));
						return true;
					}
					else
					{
						return false;
					}
				}
			}
			return false;
		}
		if (new DDoor (sec, type, speed, delay, lightTag, topcountdown))
			rtn = true;
	}
	else
	{	// [RH] Remote door

		FSectorTagIterator it(tag);
		while ((secnum = it.Next()) >= 0)
		{
			sec = &sectors[secnum];
			// if the ceiling is already moving, don't start the door action
			if (sec->PlaneMoving(sector_t::ceiling))
				continue;

			if (new DDoor (sec, type, speed, delay, lightTag, topcountdown))
				rtn = true;
		}
				
	}
	return rtn;
}